

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O0

JDIMENSION preload_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined8 *puVar1;
  JDIMENSION JVar2;
  JSAMPARRAY ppJVar3;
  j_compress_ptr in_RSI;
  long in_RDI;
  cd_progress_ptr progress;
  JDIMENSION row;
  tga_source_ptr source;
  uint local_1c;
  j_compress_ptr cinfo_00;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  cinfo_00 = in_RSI;
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x34); local_1c = local_1c + 1) {
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[1] = (ulong)local_1c;
      puVar1[2] = (ulong)*(uint *)(in_RDI + 0x34);
      (*(code *)*puVar1)(in_RDI);
    }
    ppJVar3 = (JSAMPARRAY)
              (**(code **)(*(long *)(in_RDI + 8) + 0x38))(in_RDI,in_RSI->input_gamma,local_1c,1);
    *(JSAMPARRAY *)&in_RSI->is_decompressor = ppJVar3;
    (*(code *)in_RSI->quant_tbl_ptrs[2])(in_RDI,cinfo_00);
  }
  if (puVar1 != (undefined8 *)0x0) {
    *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
  }
  in_RSI->mem = (jpeg_memory_mgr *)get_memory_row;
  in_RSI->data_precision = 0;
  JVar2 = get_memory_row(cinfo_00,(cjpeg_source_ptr)in_RSI);
  return JVar2;
}

Assistant:

METHODDEF(JDIMENSION)
preload_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  register FILE *infile = source->pub.input_file;
  register JSAMPROW out_ptr;
  JSAMPARRAY image_ptr;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the data into a virtual array in input-file row order. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image, row, (JDIMENSION)1, TRUE);
    out_ptr = image_ptr[0];
    if (fread(out_ptr, 1, source->row_width, infile) != source->row_width) {
      if (feof(infile))
        ERREXIT(cinfo, JERR_INPUT_EOF);
      else
        ERREXIT(cinfo, JERR_FILE_READ);
    }
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Set up to read from the virtual array in top-to-bottom order */
  switch (source->bits_per_pixel) {
  case 8:
    source->pub.get_pixel_rows = get_8bit_row;
    break;
  case 24:
    source->pub.get_pixel_rows = get_24bit_row;
    break;
  case 32:
    source->pub.get_pixel_rows = get_32bit_row;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  source->source_row = cinfo->image_height;

  /* And read the first row */
  return (*source->pub.get_pixel_rows) (cinfo, sinfo);
}